

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.cpp
# Opt level: O0

field_type_t cfgfile::generator::cfg::field_type_from_string(string *type)

{
  __type _Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000010;
  undefined4 local_4;
  
  _Var1 = std::operator==(in_stack_00000010,type);
  if (_Var1) {
    local_4 = scalar_field_type;
  }
  else {
    _Var1 = std::operator==(in_stack_00000010,type);
    if (_Var1) {
      local_4 = no_value_field_type;
    }
    else {
      _Var1 = std::operator==(in_stack_00000010,type);
      if (_Var1) {
        local_4 = scalar_vector_field_type;
      }
      else {
        _Var1 = std::operator==(in_stack_00000010,type);
        if (_Var1) {
          local_4 = vector_of_tags_field_type;
        }
        else {
          _Var1 = std::operator==(in_stack_00000010,type);
          if (_Var1) {
            local_4 = custom_tag_field_type;
          }
          else {
            local_4 = unknown_field_type;
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

static inline field_t::field_type_t field_type_from_string( const std::string & type )
{
	if( type == c_scalar_tag_name )
		return field_t::scalar_field_type;
	else if( type == c_no_value_tag_name )
		return field_t::no_value_field_type;
	else if( type == c_scalar_vector_tag_name )
		return field_t::scalar_vector_field_type;
	else if( type == c_vector_of_tags_tag_name )
		return field_t::vector_of_tags_field_type;
	else if( type == c_custom_tag_name )
		return field_t::custom_tag_field_type;
	else
		return field_t::unknown_field_type;
}